

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pbrt::SplitStringsFromWhitespace_abi_cxx11_(string_view str)

{
  int iVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar4;
  iterator end;
  iterator start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  value_type *in_stack_ffffffffffffff48;
  value_type *__a;
  allocator<char> *__end;
  undefined7 in_stack_ffffffffffffff70;
  byte bVar5;
  allocator<char> local_51;
  string local_50 [32];
  value_type *local_30;
  value_type *local_28;
  undefined1 local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_19 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x57c0d9);
  local_28 = (value_type *)std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
  do {
    while( true ) {
      pvVar3 = local_28;
      pvVar2 = (value_type *)std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
      bVar4 = false;
      if (pvVar3 != pvVar2) {
        iVar1 = isspace((int)(char)local_28->_M_dataplus);
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) break;
      local_28 = (value_type *)&local_28->field_0x1;
    }
    local_30 = local_28;
    while( true ) {
      pvVar3 = local_30;
      pvVar2 = (value_type *)std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
      bVar5 = 0;
      if (pvVar3 != pvVar2) {
        iVar1 = isspace((int)(char)local_30->_M_dataplus);
        bVar5 = iVar1 != 0 ^ 0xff;
      }
      if ((bVar5 & 1) == 0) break;
      local_30 = (value_type *)&local_30->field_0x1;
    }
    __end = &local_51;
    pvVar2 = local_28;
    __a = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar5,in_stack_ffffffffffffff70),(char *)pvVar3,(char *)__end,
               (allocator<char> *)__a);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pvVar2,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    local_28 = local_30;
    in_stack_ffffffffffffff48 = local_30;
    pvVar3 = (value_type *)std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
  } while (in_stack_ffffffffffffff48 != pvVar3);
  return in_RDI;
}

Assistant:

std::vector<std::string> SplitStringsFromWhitespace(std::string_view str) {
    std::vector<std::string> ret;

    std::string_view::iterator start = str.begin();
    do {
        // skip leading ws
        while (start != str.end() && isspace(*start))
            ++start;

        // |start| is at the start of the current word
        auto end = start;
        while (end != str.end() && !isspace(*end))
            ++end;

        ret.push_back(std::string(start, end));
        start = end;
    } while (start != str.end());

    return ret;
}